

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeSet::spanBack
          (UnicodeSet *this,UChar *s,int32_t length,USetSpanCondition spanCondition)

{
  UBool UVar1;
  UChar *pUVar2;
  uint32_t uVar3;
  uint32_t local_160;
  uint uStack_15c;
  uint16_t __c2;
  int32_t prev;
  UChar32 c;
  undefined1 local_148 [8];
  UnicodeSetStringSpan strSpan;
  USetSpanCondition local_28;
  uint32_t which;
  USetSpanCondition spanCondition_local;
  int32_t length_local;
  UChar *s_local;
  UnicodeSet *this_local;
  
  if ((length < 1) || (this->bmpSet == (BMPSet *)0x0)) {
    which = length;
    if (length < 0) {
      which = u_strlen_63(s);
    }
    if (which == 0) {
      this_local._4_4_ = 0;
    }
    else if (this->stringSpan == (UnicodeSetStringSpan *)0x0) {
      UVar1 = UVector::isEmpty(this->strings);
      if (UVar1 == '\0') {
        strSpan.staticLengths[0x1f] = 0x1a - (spanCondition == USET_SPAN_NOT_CONTAINED);
        UnicodeSetStringSpan::UnicodeSetStringSpan
                  ((UnicodeSetStringSpan *)local_148,this,this->strings,strSpan.staticLengths[0x1f])
        ;
        UVar1 = UnicodeSetStringSpan::needsStringSpanUTF16((UnicodeSetStringSpan *)local_148);
        if (UVar1 != '\0') {
          this_local._4_4_ =
               UnicodeSetStringSpan::spanBack
                         ((UnicodeSetStringSpan *)local_148,s,which,spanCondition);
        }
        UnicodeSetStringSpan::~UnicodeSetStringSpan((UnicodeSetStringSpan *)local_148);
        if (UVar1 != '\0') {
          return this_local._4_4_;
        }
      }
      local_28 = spanCondition;
      if (spanCondition != USET_SPAN_NOT_CONTAINED) {
        local_28 = USET_SPAN_CONTAINED;
      }
      do {
        local_160 = which;
        uVar3 = which - 1;
        uStack_15c = (uint)(ushort)s[(int)uVar3];
        if ((((uStack_15c & 0xfffffc00) == 0xdc00) && (0 < (int)uVar3)) &&
           ((s[(int)(which - 2)] & 0xfc00U) == 0xd800)) {
          uStack_15c = (uint)(ushort)s[(int)(which - 2)] * 0x400 + uStack_15c + 0xfca02400;
          uVar3 = which - 2;
        }
        which = uVar3;
        UVar1 = contains(this,uStack_15c);
      } while ((local_28 == (int)UVar1) && (local_160 = which, 0 < (int)which));
      this_local._4_4_ = local_160;
    }
    else {
      this_local._4_4_ = UnicodeSetStringSpan::spanBack(this->stringSpan,s,which,spanCondition);
    }
  }
  else {
    pUVar2 = BMPSet::spanBack(this->bmpSet,s,s + length,spanCondition);
    this_local._4_4_ = (uint32_t)((long)pUVar2 - (long)s >> 1);
  }
  return this_local._4_4_;
}

Assistant:

int32_t UnicodeSet::spanBack(const UChar *s, int32_t length, USetSpanCondition spanCondition) const {
    if(length>0 && bmpSet!=NULL) {
        return (int32_t)(bmpSet->spanBack(s, s+length, spanCondition)-s);
    }
    if(length<0) {
        length=u_strlen(s);
    }
    if(length==0) {
        return 0;
    }
    if(stringSpan!=NULL) {
        return stringSpan->spanBack(s, length, spanCondition);
    } else if(!strings->isEmpty()) {
        uint32_t which= spanCondition==USET_SPAN_NOT_CONTAINED ?
                            UnicodeSetStringSpan::BACK_UTF16_NOT_CONTAINED :
                            UnicodeSetStringSpan::BACK_UTF16_CONTAINED;
        UnicodeSetStringSpan strSpan(*this, *strings, which);
        if(strSpan.needsStringSpanUTF16()) {
            return strSpan.spanBack(s, length, spanCondition);
        }
    }

    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    UChar32 c;
    int32_t prev=length;
    do {
        U16_PREV(s, 0, length, c);
        if(spanCondition!=contains(c)) {
            break;
        }
    } while((prev=length)>0);
    return prev;
}